

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.h
# Opt level: O3

void __thiscall
embree::CommandLineParser::
CommandLineOptionClosure<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/tutorial.cpp:495:34)>
::~CommandLineOptionClosure
          (CommandLineOptionClosure<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_common_tutorial_tutorial_cpp:495:34)>
           *this)

{
  pointer pcVar1;
  
  (this->super_CommandLineOption).super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__CommandLineOption_002c3af8;
  pcVar1 = (this->super_CommandLineOption).description._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_CommandLineOption).description.field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

CommandLineOptionClosure (std::string description, const F& f) 
        : CommandLineOption(description), f(f) {}